

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::Instance>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::Instance> *recalculatePrimRef)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Instance *pIVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  float fVar7;
  float *pfVar8;
  size_t i;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [64];
  undefined1 in_register_000013c4 [12];
  LBBox3fa bn0;
  BBox1f local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = time_range;
  local_a8 = auVar11._0_16_;
  auVar19 = ZEXT1664(local_a8);
  local_c8 = vmovshdup_avx(local_a8);
  fVar18 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar7 = (set->super_PrimInfoMB).max_time_range.upper - fVar18;
  fVar17 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar12 = (((time_range.lower * 0.5 + local_c8._0_4_ * 0.5) - fVar18) / fVar7) * fVar17;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  auVar16 = vandps_avx(ZEXT416((uint)fVar12),auVar16);
  auVar14._8_4_ = 0x3effffff;
  auVar14._0_8_ = 0x3effffff3effffff;
  auVar14._12_4_ = 0x3effffff;
  auVar16 = vorps_avx(auVar16,auVar14);
  auVar16 = ZEXT416((uint)(fVar12 + auVar16._0_4_));
  auVar16 = vroundss_avx(auVar16,auVar16,0xb);
  fVar18 = (auVar16._0_4_ / fVar17) * fVar7 + fVar18;
  if ((time_range.lower < fVar18) && (fVar18 < local_c8._0_4_)) {
    local_b8 = ZEXT416((uint)fVar18);
    local_48 = vinsertps_avx(local_a8,local_b8,0x10);
    local_58._4_12_ = auVar11._4_12_;
    local_58._0_4_ = fVar18;
    pfVar8 = &prims[begin].time_range.upper;
    for (; begin < end; begin = begin + 1) {
      fVar12 = *pfVar8 * 0.9999;
      if ((auVar19._0_4_ < fVar12) && (((BBox1f *)(pfVar8 + -1))->lower * 1.0001 < fVar18)) {
        local_d0 = (BBox1f)vmovlps_avx(local_48);
        pIVar5 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar8[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar5,&local_d0,
                   &(pIVar5->super_Geometry).time_range,(pIVar5->super_Geometry).fnumTimeSegments);
        auVar19 = ZEXT1664(local_a8);
        aVar2 = this->bounds0[0].bounds0.upper.field_0;
        aVar3 = this->bounds0[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)vminps_avx(this->bounds0[0].bounds0.lower.field_0,local_98.m128);
        aVar4 = this->bounds0[0].bounds1.upper.field_0;
        this->bounds0[0].bounds0.lower.field_0 = aVar6;
        aVar2.m128 = (__m128)vmaxps_avx(aVar2.m128,local_88);
        this->bounds0[0].bounds0.upper.field_0 = aVar2;
        aVar2.m128 = (__m128)vminps_avx(aVar3.m128,local_78);
        this->bounds0[0].bounds1.lower.field_0 = aVar2;
        aVar2.m128 = (__m128)vmaxps_avx(aVar4.m128,local_68);
        this->bounds0[0].bounds1.upper.field_0 = aVar2;
        auVar9._0_4_ = (float)(uint)pfVar8[-2];
        auVar9._4_12_ = in_register_000013c4;
        BVar1 = *(BBox1f *)(pfVar8 + -1);
        auVar13._8_8_ = 0;
        auVar13._0_4_ = BVar1.lower;
        auVar13._4_4_ = BVar1.upper;
        auVar16 = vmovshdup_avx(auVar13);
        fVar12 = BVar1.lower;
        fVar18 = auVar16._0_4_ - fVar12;
        auVar16 = ZEXT416((uint)(((local_a8._0_4_ - fVar12) / fVar18) * 1.0000002 * auVar9._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,9);
        auVar16 = vmaxss_avx(ZEXT816(0) << 0x40,auVar16);
        auVar14 = ZEXT416((uint)((((float)local_b8._0_4_ - fVar12) / fVar18) * 0.99999976 *
                                auVar9._0_4_));
        auVar14 = vroundss_avx(auVar14,auVar14,10);
        auVar14 = vminss_avx(auVar14,auVar9);
        this->count0[0] = this->count0[0] + (long)((int)auVar14._0_4_ - (int)auVar16._0_4_);
        fVar12 = *pfVar8 * 0.9999;
        fVar18 = (float)local_b8._0_4_;
      }
      if ((fVar18 < fVar12) && (((BBox1f *)(pfVar8 + -1))->lower * 1.0001 < (float)local_c8._0_4_))
      {
        local_d0 = (BBox1f)vmovlps_avx(local_58);
        pIVar5 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar8[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar5,&local_d0,
                   &(pIVar5->super_Geometry).time_range,(pIVar5->super_Geometry).fnumTimeSegments);
        auVar19 = ZEXT1664(local_a8);
        aVar2 = this->bounds1[0].bounds0.upper.field_0;
        aVar3 = this->bounds1[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)vminps_avx(this->bounds1[0].bounds0.lower.field_0,local_98.m128);
        aVar4 = this->bounds1[0].bounds1.upper.field_0;
        this->bounds1[0].bounds0.lower.field_0 = aVar6;
        aVar2.m128 = (__m128)vmaxps_avx(aVar2.m128,local_88);
        this->bounds1[0].bounds0.upper.field_0 = aVar2;
        aVar2.m128 = (__m128)vminps_avx(aVar3.m128,local_78);
        this->bounds1[0].bounds1.lower.field_0 = aVar2;
        aVar2.m128 = (__m128)vmaxps_avx(aVar4.m128,local_68);
        this->bounds1[0].bounds1.upper.field_0 = aVar2;
        auVar10._0_4_ = (float)(uint)pfVar8[-2];
        auVar10._4_12_ = in_register_000013c4;
        BVar1 = *(BBox1f *)(pfVar8 + -1);
        auVar15._8_8_ = 0;
        auVar15._0_4_ = BVar1.lower;
        auVar15._4_4_ = BVar1.upper;
        fVar12 = BVar1.lower;
        auVar16 = vmovshdup_avx(auVar15);
        fVar18 = auVar16._0_4_ - fVar12;
        auVar16 = ZEXT416((uint)((((float)local_b8._0_4_ - fVar12) / fVar18) * 1.0000002 *
                                auVar10._0_4_));
        auVar16 = vroundss_avx(auVar16,auVar16,9);
        auVar16 = vmaxss_avx(ZEXT816(0) << 0x20,auVar16);
        auVar14 = ZEXT416((uint)((((float)local_c8._0_4_ - fVar12) / fVar18) * 0.99999976 *
                                auVar10._0_4_));
        auVar14 = vroundss_avx(auVar14,auVar14,10);
        auVar14 = vminss_avx(auVar14,auVar10);
        this->count1[0] = this->count1[0] + (long)((int)auVar14._0_4_ - (int)auVar16._0_4_);
        fVar18 = (float)local_b8._0_4_;
      }
      pfVar8 = pfVar8 + 0x14;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }